

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_metadata_info.cpp
# Opt level: O3

void duckdb::PragmaMetadataInfo::RegisterFunction(BuiltinFunctions *set)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<duckdb::TableFunction,_true> *this;
  vector<duckdb::TableFunction,_true> *this_00;
  initializer_list<duckdb::LogicalType> __l;
  TableFunctionSet metadata_info;
  allocator_type local_459;
  vector<duckdb::LogicalType,_true> local_458;
  LogicalType local_438;
  TableFunctionSet local_420;
  string local_3e8;
  TableFunctionSet local_3c8;
  TableFunction local_390;
  TableFunction local_1d8;
  
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"pragma_metadata_info","");
  TableFunctionSet::TableFunctionSet(&local_3c8,&local_3e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  local_458.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_458.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TableFunction::TableFunction
            (&local_1d8,&local_458,PragmaMetadataInfoFunction,PragmaMetadataInfoBind,
             PragmaMetadataInfoInit,(table_function_init_local_t)0x0);
  this_00 = &local_3c8.super_FunctionSet<duckdb::TableFunction>.functions;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&this_00->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &local_1d8);
  local_1d8.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__TableFunction_02435168;
  if (local_1d8.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d8.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_1d8.super_SimpleNamedParameterFunction);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_458);
  LogicalType::LogicalType(&local_438,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_438;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_458,__l,
             &local_459);
  TableFunction::TableFunction
            (&local_390,&local_458,PragmaMetadataInfoFunction,PragmaMetadataInfoBind,
             PragmaMetadataInfoInit,(table_function_init_local_t)0x0);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::
  emplace_back<duckdb::TableFunction>
            (&this_00->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &local_390);
  local_390.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__TableFunction_02435168;
  if (local_390.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_390.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_390.super_SimpleNamedParameterFunction);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_458);
  LogicalType::~LogicalType(&local_438);
  paVar1 = &local_420.super_FunctionSet<duckdb::TableFunction>.name.field_2;
  local_420.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_420,
             local_3c8.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p,
             local_3c8.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p +
             local_3c8.super_FunctionSet<duckdb::TableFunction>.name._M_string_length);
  this = &local_420.super_FunctionSet<duckdb::TableFunction>.functions;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::vector
            (&this->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             &this_00->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  BuiltinFunctions::AddFunction(set,&local_420);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&this->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_420.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p);
  }
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&this_00->super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p !=
      &local_3c8.super_FunctionSet<duckdb::TableFunction>.name.field_2) {
    operator_delete(local_3c8.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void PragmaMetadataInfo::RegisterFunction(BuiltinFunctions &set) {
	TableFunctionSet metadata_info("pragma_metadata_info");
	metadata_info.AddFunction(
	    TableFunction({}, PragmaMetadataInfoFunction, PragmaMetadataInfoBind, PragmaMetadataInfoInit));
	metadata_info.AddFunction(TableFunction({LogicalType::VARCHAR}, PragmaMetadataInfoFunction, PragmaMetadataInfoBind,
	                                        PragmaMetadataInfoInit));
	set.AddFunction(metadata_info);
}